

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesglobaltypes.cpp
# Opt level: O0

bool __thiscall
StimulationCommand::setChannels
          (StimulationCommand *this,int cathodeNTrode,int cathodeChan,int anodeNTrode,int anodeChan)

{
  int anodeChan_local;
  int anodeNTrode_local;
  int cathodeChan_local;
  int cathodeNTrode_local;
  StimulationCommand *this_local;
  bool local_1;
  
  if ((cathodeChan < 0) || (anodeChan < 0)) {
    local_1 = false;
  }
  else {
    this->cathodeChannel = (uint16_t)cathodeChan;
    this->anodeChannel = (uint16_t)anodeChan;
    this->cathodeNtrodeID = (uint16_t)cathodeNTrode;
    this->anodeNtrodeID = (uint16_t)anodeNTrode;
    this->channelIsSet = true;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StimulationCommand::setChannels(int cathodeNTrode, int cathodeChan, int anodeNTrode, int anodeChan) {
    if ( (cathodeChan < 0) || (anodeChan < 0)) { //maybe also check that the channels are stim capable?
        return false;
    }

    cathodeChannel = cathodeChan;
    anodeChannel = anodeChan;
    cathodeNtrodeID = cathodeNTrode;
    anodeNtrodeID = anodeNTrode;
    channelIsSet = true;
    return true;
}